

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(SafeAreaMarginsChangedEvent *wse)

{
  long lVar1;
  bool bVar2;
  QWindow *pQVar3;
  long in_FS_OFFSET;
  QMargins _t1;
  QEvent event;
  QWindow *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPointer<QWindow>::isNull((QPointer<QWindow> *)0x36a099);
  if (!bVar2) {
    pQVar3 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x36a0b2);
    QPointer<QWindow>::operator->((QPointer<QWindow> *)0x36a0c4);
    _t1 = QWindow::safeAreaMargins(in_stack_ffffffffffffffe8);
    QWindow::safeAreaMarginsChanged(pQVar3,_t1);
    QEvent::QEvent((QEvent *)&stack0xffffffffffffffe8,SafeAreaMarginsChange);
    pQVar3 = ::QPointer::operator_cast_to_QWindow_((QPointer<QWindow> *)0x36a11e);
    QCoreApplication::sendSpontaneousEvent((QObject *)pQVar3,(QEvent *)&stack0xffffffffffffffe8);
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *wse)
{
    if (wse->window.isNull())
        return;

    emit wse->window->safeAreaMarginsChanged(wse->window->safeAreaMargins());

    QEvent event(QEvent::SafeAreaMarginsChange);
    QGuiApplication::sendSpontaneousEvent(wse->window, &event);
}